

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<duckdb::SQLIdentifier>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,SQLIdentifier *param)

{
  SQLIdentifier *in_RCX;
  string *in_RDI;
  value_type *in_stack_ffffffffffffff48;
  string *msg_00;
  SQLIdentifier *in_stack_ffffffffffffff88;
  
  msg_00 = in_RDI;
  SQLIdentifier::SQLIdentifier(in_RCX,(SQLIdentifier *)in_stack_ffffffffffffff48);
  ExceptionFormatValue::CreateFormatValue<duckdb::SQLIdentifier>(in_stack_ffffffffffffff88);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            in_RCX,in_stack_ffffffffffffff48);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x2620d9);
  SQLIdentifier::~SQLIdentifier((SQLIdentifier *)0x2620e3);
  ConstructMessageRecursive
            (msg_00,(vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                     *)in_RCX);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}